

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::passColName(Highs *this,HighsInt col,string *name)

{
  int iVar1;
  undefined8 uVar2;
  reference this_00;
  string *in_RDX;
  uint in_ESI;
  HighsNameHash *in_RDI;
  HighsInt num_col;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  HighsNameHash *this_01;
  HighsStatus local_4;
  
  uVar3 = *(uint *)((long)(in_RDI + 5) + 0x20);
  if (((int)in_ESI < 0) || ((int)uVar3 <= (int)in_ESI)) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)((long)(in_RDI + 0x40) + 0x28),kError,
                 "Index %d for column name %s is outside the range [0, num_col = %d)\n",
                 (ulong)in_ESI,uVar2,(ulong)uVar3);
    local_4 = kError;
  }
  else {
    this_01 = in_RDI;
    iVar1 = std::__cxx11::string::length();
    if (iVar1 < 1) {
      highsLogUser((HighsLogOptions *)((long)(in_RDI + 0x40) + 0x28),kError,
                   "Cannot define empty column names\n");
      local_4 = kError;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)(in_RDI + 0xb) + 0x18),(long)(int)in_ESI);
      HighsNameHash::update
                (this_01,in_ESI,in_RDX,(string *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)(in_RDI + 0xb) + 0x18),(long)(int)in_ESI);
      std::__cxx11::string::operator=((string *)this_00,(string *)in_RDX);
      local_4 = kOk;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::passColName(const HighsInt col, const std::string& name) {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for column name %s is outside the range [0, num_col = %d)\n",
        int(col), name.c_str(), int(num_col));
    return HighsStatus::kError;
  }
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty column names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.col_names_.resize(num_col);
  this->model_.lp_.col_hash_.update(col, this->model_.lp_.col_names_[col],
                                    name);
  this->model_.lp_.col_names_[col] = name;
  return HighsStatus::kOk;
}